

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::
dumpInstructions<std::set<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
          *instructions)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (instructions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(instructions->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Instruction::dump(*(Instruction **)(p_Var1 + 1),out);
  }
  return;
}

Assistant:

void Builder::dumpInstructions(std::vector<unsigned int>& out, const Range& instructions) const
{
    for (const auto& inst : instructions) {
        inst->dump(out);
    }
}